

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::AddInventory(AActor *this,AInventory *item)

{
  DWORD DVar1;
  bool bVar2;
  AActor *pAVar3;
  AInventory *pAVar4;
  AInventory *item_local;
  AActor *this_local;
  
  bVar2 = TObjPtr<AActor>::operator!=(&item->Owner,(AActor *)0x0);
  if (bVar2) {
    bVar2 = TObjPtr<AActor>::operator==(&item->Owner,this);
    if (bVar2) {
      return;
    }
    pAVar3 = TObjPtr<AActor>::operator->(&item->Owner);
    (*(pAVar3->super_DThinker).super_DObject._vptr_DObject[0x1b])(pAVar3,item);
  }
  TObjPtr<AActor>::operator=(&item->Owner,this);
  (item->super_AActor).Inventory.field_0 = (this->Inventory).field_0;
  TObjPtr<AInventory>::operator=(&this->Inventory,item);
  DVar1 = this->InventoryID;
  this->InventoryID = DVar1 + 1;
  pAVar4 = TObjPtr<AInventory>::operator->(&this->Inventory);
  (pAVar4->super_AActor).InventoryID = DVar1;
  return;
}

Assistant:

void AActor::AddInventory (AInventory *item)
{
	// Check if it's already attached to an actor
	if (item->Owner != NULL)
	{
		// Is it attached to us?
		if (item->Owner == this)
			return;

		// No, then remove it from the other actor first
		item->Owner->RemoveInventory (item);
	}

	item->Owner = this;
	item->Inventory = Inventory;
	Inventory = item;

	// Each item receives an unique ID when added to an actor's inventory.
	// This is used by the DEM_INVUSE command to identify the item. Simply
	// using the item's position in the list won't work, because ticcmds get
	// run sometime in the future, so by the time it runs, the inventory
	// might not be in the same state as it was when DEM_INVUSE was sent.
	Inventory->InventoryID = InventoryID++;
}